

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpEventServer.cpp
# Opt level: O0

void __thiscall ConnQueue::ConnQueue(ConnQueue *this)

{
  Conn *pCVar1;
  ConnQueue *this_local;
  
  pCVar1 = (Conn *)operator_new(0x30);
  Conn::Conn(pCVar1,0);
  this->m_head = pCVar1;
  pCVar1 = (Conn *)operator_new(0x30);
  Conn::Conn(pCVar1,0);
  this->m_tail = pCVar1;
  this->m_tail->m_Next = (Conn *)0x0;
  this->m_head->m_Prev = (Conn *)0x0;
  this->m_head->m_Next = this->m_tail;
  this->m_tail->m_Prev = this->m_head;
  return;
}

Assistant:

ConnQueue::ConnQueue()
{
    //建立头尾结点，并调整其指针
    m_head = new Conn(0);
    m_tail = new Conn(0);
    m_head->m_Prev = m_tail->m_Next = NULL;
    m_head->m_Next = m_tail;
    m_tail->m_Prev = m_head;
}